

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQuerySpecification.cpp
# Opt level: O0

void __thiscall
DIS::RecordQuerySpecification::~RecordQuerySpecification(RecordQuerySpecification *this)

{
  RecordQuerySpecification *this_local;
  
  this->_vptr_RecordQuerySpecification = (_func_int **)&PTR__RecordQuerySpecification_00268aa0;
  std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::clear(&this->_records);
  std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::~vector(&this->_records);
  return;
}

Assistant:

RecordQuerySpecification::~RecordQuerySpecification()
{
    _records.clear();
}